

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Textures::GetSetParameterTest::CompareAndLog
          (GetSetParameterTest *this,GLfloat *value_src,GLfloat *value_dst,GLenum pname)

{
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar1;
  float fVar2;
  Enum<int,_2UL> EVar3;
  Enum<int,_2UL> local_1d0 [2];
  MessageBuilder local_1b0;
  GLenum local_2c;
  GLfloat *pGStack_28;
  GLenum pname_local;
  GLfloat *value_dst_local;
  GLfloat *value_src_local;
  GetSetParameterTest *this_local;
  
  local_2c = pname;
  pGStack_28 = value_dst;
  value_dst_local = value_src;
  value_src_local = (GLfloat *)this;
  fVar2 = de::abs<float>(*value_src - *value_dst);
  if ((((fVar2 <= 0.0125) &&
       (fVar2 = de::abs<float>(value_dst_local[1] - pGStack_28[1]), fVar2 <= 0.0125)) &&
      (fVar2 = de::abs<float>(value_dst_local[2] - pGStack_28[2]), fVar2 <= 0.0125)) &&
     (fVar2 = de::abs<float>(value_dst_local[3] - pGStack_28[3]), fVar2 <= 0.0125)) {
    return true;
  }
  this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  this_01 = tcu::TestContext::getLog(this_00);
  tcu::TestLog::operator<<(&local_1b0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_1b0,(char (*) [24])"Queried value of pname ");
  EVar3 = glu::getTextureParameterStr(local_2c);
  local_1d0[0].m_getName = EVar3.m_getName;
  local_1d0[0].m_value = EVar3.m_value;
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,local_1d0);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [15])0x2a757ff);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,pGStack_28);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [3])0x2a4b1eb);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,pGStack_28 + 1);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [3])0x2a4b1eb);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,pGStack_28 + 2);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [3])0x2a4b1eb);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,pGStack_28 + 3);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [12])"], however ");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,value_dst_local);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [3])0x2a4b1eb);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,value_dst_local + 1);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [3])0x2a4b1eb);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,value_dst_local + 2);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [3])0x2a4b1eb);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,value_dst_local + 3);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [28])"] was expected. Test fails.");
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  return false;
}

Assistant:

bool GetSetParameterTest::CompareAndLog(glw::GLfloat value_src[4], glw::GLfloat value_dst[4], glw::GLenum pname)
{
	if ((de::abs(value_src[0] - value_dst[0]) > 0.0125 /* Precision */) ||
		(de::abs(value_src[1] - value_dst[1]) > 0.0125 /* Precision */) ||
		(de::abs(value_src[2] - value_dst[2]) > 0.0125 /* Precision */) ||
		(de::abs(value_src[3] - value_dst[3]) > 0.0125 /* Precision */))
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Queried value of pname " << glu::getTextureParameterStr(pname)
			<< " is equal to [" << value_dst[0] << ", " << value_dst[1] << ", " << value_dst[2] << ", " << value_dst[3]
			<< "], however " << value_src[0] << ", " << value_src[1] << ", " << value_src[2] << ", " << value_src[3]
			<< "] was expected. Test fails." << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}